

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::InstallProjectViaInstallScript
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  reference filename;
  allocator<char> local_b61;
  undefined1 local_b60 [6];
  bool res;
  allocator<char> local_b39;
  string local_b38;
  string local_b18 [32];
  undefined1 local_af8 [8];
  ostringstream cmCPackLog_msg_5;
  string local_980 [32];
  undefined1 local_960 [8];
  ostringstream cmCPackLog_msg_4;
  allocator<char> local_7e1;
  string local_7e0;
  string local_7c0 [32];
  undefined1 local_7a0 [8];
  ostringstream cmCPackLog_msg_3;
  string local_628 [32];
  undefined1 local_608 [8];
  ostringstream cmCPackLog_msg_2;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  string local_418 [8];
  string dir;
  undefined1 local_3d8 [8];
  ostringstream cmCPackLog_msg_1;
  string *installScript;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_238;
  undefined1 local_218 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeScriptsVector;
  ostringstream local_1e0 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *cmakeScripts;
  string *tempInstallDirectory_local;
  cmCPackGenerator *pcStack_18;
  bool setDestDir_local;
  cmCPackGenerator *this_local;
  
  cmakeScripts = (char *)tempInstallDirectory;
  tempInstallDirectory_local._7_1_ = setDestDir;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CPACK_INSTALL_SCRIPT",&local_51);
  pcVar4 = GetOption(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
    local_30 = pcVar4;
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,"- Install scripts: ");
    poVar5 = std::operator<<(poVar5,local_30);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x1c6,pcVar4);
    std::__cxx11::string::~string
              ((string *)
               &cmakeScriptsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_218);
    pcVar4 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,pcVar4,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218,false);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_218);
    installScript =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_218);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&installScript), bVar2) {
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
      poVar5 = std::operator<<((ostream *)local_3d8,"- Install script: ");
      poVar5 = std::operator<<(poVar5,(string *)filename);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x1cc,pcVar4);
      std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
      if ((tempInstallDirectory_local._7_1_ & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e0,"CMAKE_INSTALL_PREFIX",&local_7e1);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        SetOption(this,&local_7e0,pcVar4);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::allocator<char>::~allocator(&local_7e1);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_960);
        poVar5 = std::operator<<((ostream *)local_960,
                                 "- Using non-DESTDIR install... (this->SetOption)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1e5,pcVar4);
        std::__cxx11::string::~string(local_980);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_960);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af8);
        poVar5 = std::operator<<((ostream *)local_af8,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,(string *)cmakeScripts);
        poVar5 = std::operator<<(poVar5,"\'");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1e8,pcVar4);
        std::__cxx11::string::~string(local_b18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af8);
      }
      else {
        std::__cxx11::string::string(local_418);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_438,"CPACK_INSTALL_PREFIX",&local_439);
        pcVar4 = GetOption(this,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator(&local_439);
        if (pcVar4 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_460,"CPACK_INSTALL_PREFIX",&local_461);
          pcVar4 = GetOption(this,&local_460);
          std::__cxx11::string::operator+=(local_418,pcVar4);
          std::__cxx11::string::~string((string *)&local_460);
          std::allocator<char>::~allocator(&local_461);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,"CMAKE_INSTALL_PREFIX",&local_489);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        SetOption(this,&local_488,pcVar4);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator(&local_489);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        poVar5 = std::operator<<((ostream *)local_608,
                                 "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1dc,pcVar4);
        std::__cxx11::string::~string(local_628);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a0);
        poVar5 = std::operator<<((ostream *)local_7a0,"- Setting CMAKE_INSTALL_PREFIX to \'");
        poVar5 = std::operator<<(poVar5,local_418);
        poVar5 = std::operator<<(poVar5,"\'");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1df,pcVar4);
        std::__cxx11::string::~string(local_7c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a0);
        std::__cxx11::string::~string(local_418);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b38,"CMAKE_CURRENT_BINARY_DIR",&local_b39);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_b38,pcVar4);
      std::__cxx11::string::~string((string *)&local_b38);
      std::allocator<char>::~allocator(&local_b39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b60,"CMAKE_CURRENT_SOURCE_DIR",&local_b61);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,(string *)local_b60,pcVar4);
      std::__cxx11::string::~string((string *)local_b60);
      std::allocator<char>::~allocator(&local_b61);
      bVar2 = cmMakefile::ReadListFile(this->MakefileMap,filename);
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if ((bVar3) || (!bVar2)) {
        this_local._4_4_ = 0;
        bVar2 = true;
        goto LAB_00154d96;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = false;
LAB_00154d96:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_218);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallScript(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  const char* cmakeScripts = this->GetOption("CPACK_INSTALL_SCRIPT");
  if (cmakeScripts && *cmakeScripts) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Install scripts: " << cmakeScripts << std::endl);
    std::vector<std::string> cmakeScriptsVector;
    cmSystemTools::ExpandListArgument(cmakeScripts, cmakeScriptsVector);
    for (std::string const& installScript : cmakeScriptsVector) {

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install script: " << installScript << std::endl);

      if (setDestDir) {
        // For DESTDIR based packaging, use the *project* CMAKE_INSTALL_PREFIX
        // underneath the tempInstallDirectory. The value of the project's
        // CMAKE_INSTALL_PREFIX is sent in here as the value of the
        // CPACK_INSTALL_PREFIX variable.

        std::string dir;
        if (this->GetOption("CPACK_INSTALL_PREFIX")) {
          dir += this->GetOption("CPACK_INSTALL_PREFIX");
        }
        this->SetOption("CMAKE_INSTALL_PREFIX", dir.c_str());
        cmCPackLogger(
          cmCPackLog::LOG_DEBUG,
          "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)"
            << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                            << std::endl);
      } else {
        this->SetOption("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Using non-DESTDIR install... (this->SetOption)"
                        << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "- Setting CMAKE_INSTALL_PREFIX to '"
                        << tempInstallDirectory << "'" << std::endl);
      }

      this->SetOptionIfNotSet("CMAKE_CURRENT_BINARY_DIR",
                              tempInstallDirectory.c_str());
      this->SetOptionIfNotSet("CMAKE_CURRENT_SOURCE_DIR",
                              tempInstallDirectory.c_str());
      bool res = this->MakefileMap->ReadListFile(installScript);
      if (cmSystemTools::GetErrorOccuredFlag() || !res) {
        return 0;
      }
    }
  }
  return 1;
}